

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  float **ppfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  Geometry *pGVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  int iVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  long lVar30;
  RTCFilterFunctionN p_Var31;
  RTCRayN *pRVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  Scene *pSVar37;
  uint *puVar38;
  long lVar39;
  ulong uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar55;
  undefined1 auVar56 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar63;
  float fVar64;
  float fVar88;
  float fVar90;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar89;
  float fVar91;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar119;
  float fVar120;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar121;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  float fVar123;
  float fVar131;
  float fVar133;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar132;
  float fVar134;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar147;
  undefined1 auVar146 [16];
  float fVar148;
  undefined1 auVar149 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  vbool<4> valid;
  float local_1428;
  float fStack_1424;
  float fStack_1420;
  float fStack_141c;
  float fStack_1410;
  float fStack_140c;
  undefined1 local_13e8 [16];
  undefined1 local_13c8 [16];
  Scene *scene;
  float local_13a8;
  float fStack_13a4;
  float fStack_13a0;
  float fStack_139c;
  RTCFilterFunctionNArguments args;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  float fStack_1350;
  float fStack_134c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_12fc;
  vfloat<4> tNear;
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  float local_1268 [4];
  float local_1258 [4];
  undefined1 local_1248 [8];
  float fStack_1240;
  float fStack_123c;
  float local_1238 [4];
  uint local_1228;
  uint uStack_1224;
  uint uStack_1220;
  uint uStack_121c;
  undefined1 local_1218 [16];
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [8];
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  long local_11b0;
  long local_11a8;
  ulong local_11a0;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined1 local_1178 [8];
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [8];
  float fStack_1160;
  float fStack_115c;
  undefined1 local_1158 [8];
  float fStack_1150;
  float fStack_114c;
  undefined4 local_1148;
  undefined4 uStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  uint local_1108;
  uint uStack_1104;
  uint uStack_1100;
  uint uStack_10fc;
  uint local_10f8;
  uint uStack_10f4;
  uint uStack_10f0;
  uint uStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar29 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar91 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar89 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar90 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar163 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar167 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar172 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar148 = fVar163 * 0.99999964;
  fVar150 = fVar167 * 0.99999964;
  fVar185 = fVar172 * 0.99999964;
  fVar163 = fVar163 * 1.0000004;
  fVar167 = fVar167 * 1.0000004;
  fVar172 = fVar172 * 1.0000004;
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_11a0 = uVar36 ^ 0x10;
  iVar26 = (tray->tnear).field_0.i[k];
  auVar138._4_4_ = iVar26;
  auVar138._0_4_ = iVar26;
  auVar138._8_4_ = iVar26;
  auVar138._12_4_ = iVar26;
  iVar26 = (tray->tfar).field_0.i[k];
  auVar165._4_4_ = iVar26;
  auVar165._0_4_ = iVar26;
  auVar165._8_4_ = iVar26;
  auVar165._12_4_ = iVar26;
  auVar65._8_4_ = 0xffffffff;
  auVar65._0_8_ = 0xffffffffffffffff;
  auVar65._12_4_ = 0xffffffff;
  local_1048 = mm_lookupmask_ps._0_16_;
  local_1068 = mm_lookupmask_ps._0_16_ ^ auVar65;
  local_1058 = mm_lookupmask_ps._240_16_;
  local_1078 = mm_lookupmask_ps._240_16_ ^ auVar65;
  local_1088 = fVar91;
  fStack_1084 = fVar91;
  fStack_1080 = fVar91;
  fStack_107c = fVar91;
  local_1098 = fVar89;
  fStack_1094 = fVar89;
  fStack_1090 = fVar89;
  fStack_108c = fVar89;
  local_10a8 = fVar90;
  fStack_10a4 = fVar90;
  fStack_10a0 = fVar90;
  fStack_109c = fVar90;
  local_10b8 = fVar163;
  fStack_10b4 = fVar163;
  fStack_10b0 = fVar163;
  fStack_10ac = fVar163;
  local_10c8 = fVar167;
  fStack_10c4 = fVar167;
  fStack_10c0 = fVar167;
  fStack_10bc = fVar167;
  local_10d8 = fVar172;
  fStack_10d4 = fVar172;
  fStack_10d0 = fVar172;
  fStack_10cc = fVar172;
  local_10e8 = fVar185;
  fStack_10e4 = fVar185;
  fStack_10e0 = fVar185;
  fStack_10dc = fVar185;
  local_1188 = fVar148;
  fStack_1184 = fVar148;
  fStack_1180 = fVar148;
  fStack_117c = fVar148;
  local_1198 = fVar150;
  fStack_1194 = fVar150;
  fStack_1190 = fVar150;
  fStack_118c = fVar150;
  local_1218 = auVar138;
  fVar152 = fVar148;
  fVar64 = fVar148;
  fVar88 = fVar148;
  fVar173 = fVar150;
  fVar176 = fVar150;
  fVar179 = fVar150;
  fVar160 = fVar163;
  fVar159 = fVar163;
  fVar158 = fVar163;
  fVar157 = fVar90;
  fVar156 = fVar90;
  fVar155 = fVar90;
  fVar154 = fVar89;
  fVar147 = fVar89;
  fVar153 = fVar89;
  fVar151 = fVar185;
  fVar134 = fVar185;
  fVar133 = fVar185;
  fVar132 = fVar172;
  fVar131 = fVar172;
  fVar123 = fVar172;
  fVar122 = fVar167;
  fVar121 = fVar167;
  fVar120 = fVar167;
  fVar119 = fVar91;
  fVar106 = fVar91;
  fVar182 = fVar91;
LAB_001f4150:
  do {
    pSVar25 = pSVar29 + -1;
    pSVar29 = pSVar29 + -1;
    if ((float)pSVar25->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar25->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar10 = (pSVar29->ptr).ptr;
      while ((uVar10 & 8) == 0) {
        pfVar8 = (float *)(uVar10 + 0x20 + uVar36);
        auVar92._0_4_ = (*pfVar8 - fVar182) * fVar148;
        auVar92._4_4_ = (pfVar8[1] - fVar106) * fVar152;
        auVar92._8_4_ = (pfVar8[2] - fVar119) * fVar64;
        auVar92._12_4_ = (pfVar8[3] - fVar91) * fVar88;
        pfVar8 = (float *)(uVar10 + 0x20 + uVar35);
        auVar127._0_4_ = (*pfVar8 - fVar153) * fVar150;
        auVar127._4_4_ = (pfVar8[1] - fVar147) * fVar173;
        auVar127._8_4_ = (pfVar8[2] - fVar154) * fVar176;
        auVar127._12_4_ = (pfVar8[3] - fVar89) * fVar179;
        auVar65 = maxps(auVar92,auVar127);
        pfVar8 = (float *)(uVar10 + 0x20 + uVar40);
        auVar136._0_4_ = (*pfVar8 - fVar155) * fVar133;
        auVar136._4_4_ = (pfVar8[1] - fVar156) * fVar134;
        auVar136._8_4_ = (pfVar8[2] - fVar157) * fVar151;
        auVar136._12_4_ = (pfVar8[3] - fVar90) * fVar185;
        auVar92 = maxps(auVar136,auVar138);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar65,auVar92);
        pfVar8 = (float *)(uVar10 + 0x20 + local_11a0);
        auVar145._0_4_ = (*pfVar8 - fVar182) * fVar158;
        auVar145._4_4_ = (pfVar8[1] - fVar106) * fVar159;
        auVar145._8_4_ = (pfVar8[2] - fVar119) * fVar160;
        auVar145._12_4_ = (pfVar8[3] - fVar91) * fVar163;
        pfVar8 = (float *)(uVar10 + 0x20 + (uVar35 ^ 0x10));
        auVar107._0_4_ = (*pfVar8 - fVar153) * fVar120;
        auVar107._4_4_ = (pfVar8[1] - fVar147) * fVar121;
        auVar107._8_4_ = (pfVar8[2] - fVar154) * fVar122;
        auVar107._12_4_ = (pfVar8[3] - fVar89) * fVar167;
        auVar65 = minps(auVar145,auVar107);
        pfVar8 = (float *)(uVar10 + 0x20 + (uVar40 ^ 0x10));
        auVar108._0_4_ = (*pfVar8 - fVar155) * fVar123;
        auVar108._4_4_ = (pfVar8[1] - fVar156) * fVar131;
        auVar108._8_4_ = (pfVar8[2] - fVar157) * fVar132;
        auVar108._12_4_ = (pfVar8[3] - fVar90) * fVar172;
        auVar92 = minps(auVar108,auVar165);
        auVar65 = minps(auVar65,auVar92);
        auVar110._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar65._4_4_);
        auVar110._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar65._0_4_);
        auVar110._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar65._8_4_);
        auVar110._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar65._12_4_);
        uVar34 = movmskps((int)local_11a0,auVar110);
        if (uVar34 == 0) {
          if (pSVar29 == stack) {
            return;
          }
          goto LAB_001f4150;
        }
        uVar34 = uVar34 & 0xff;
        uVar33 = uVar10 & 0xfffffffffffffff0;
        lVar30 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
          }
        }
        uVar10 = *(ulong *)(uVar33 + lVar30 * 8);
        uVar34 = uVar34 - 1 & uVar34;
        if (uVar34 != 0) {
          uVar41 = tNear.field_0.i[lVar30];
          lVar30 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          uVar11 = *(ulong *)(uVar33 + lVar30 * 8);
          uVar42 = tNear.field_0.i[lVar30];
          uVar34 = uVar34 - 1 & uVar34;
          if (uVar34 == 0) {
            if (uVar41 < uVar42) {
              (pSVar29->ptr).ptr = uVar11;
              pSVar29->dist = uVar42;
              pSVar29 = pSVar29 + 1;
            }
            else {
              (pSVar29->ptr).ptr = uVar10;
              pSVar29->dist = uVar41;
              pSVar29 = pSVar29 + 1;
              uVar10 = uVar11;
            }
          }
          else {
            auVar66._8_4_ = uVar41;
            auVar66._0_8_ = uVar10;
            auVar66._12_4_ = 0;
            auVar93._8_4_ = uVar42;
            auVar93._0_8_ = uVar11;
            auVar93._12_4_ = 0;
            lVar30 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            uVar10 = *(ulong *)(uVar33 + lVar30 * 8);
            iVar26 = tNear.field_0.i[lVar30];
            auVar109._8_4_ = iVar26;
            auVar109._0_8_ = uVar10;
            auVar109._12_4_ = 0;
            auVar124._8_4_ = -(uint)((int)uVar41 < (int)uVar42);
            uVar34 = uVar34 - 1 & uVar34;
            auVar138 = local_1218;
            if (uVar34 == 0) {
              auVar124._4_4_ = auVar124._8_4_;
              auVar124._0_4_ = auVar124._8_4_;
              auVar124._12_4_ = auVar124._8_4_;
              auVar65 = auVar66 & auVar124 | ~auVar124 & auVar93;
              auVar92 = auVar93 & auVar124 | ~auVar124 & auVar66;
              auVar125._8_4_ = -(uint)(auVar65._8_4_ < iVar26);
              auVar125._0_8_ = CONCAT44(auVar125._8_4_,auVar125._8_4_);
              auVar125._12_4_ = auVar125._8_4_;
              auVar110 = auVar109 & auVar125 | ~auVar125 & auVar65;
              auVar67._8_4_ = -(uint)(auVar92._8_4_ < auVar110._8_4_);
              auVar67._4_4_ = auVar67._8_4_;
              auVar67._0_4_ = auVar67._8_4_;
              auVar67._12_4_ = auVar67._8_4_;
              *pSVar29 = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar67 & auVar92 | auVar110 & auVar67);
              pSVar29[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (auVar92 & auVar67 | ~auVar67 & auVar110);
              pSVar29 = pSVar29 + 2;
              uVar10 = ~auVar125._0_8_ & uVar10 | auVar65._0_8_ & auVar125._0_8_;
            }
            else {
              lVar30 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              iVar9 = tNear.field_0.i[lVar30];
              auVar135._8_4_ = iVar9;
              auVar135._0_8_ = *(undefined8 *)(uVar33 + lVar30 * 8);
              auVar135._12_4_ = 0;
              auVar126._4_4_ = auVar124._8_4_;
              auVar126._0_4_ = auVar124._8_4_;
              auVar126._8_4_ = auVar124._8_4_;
              auVar126._12_4_ = auVar124._8_4_;
              auVar65 = auVar66 & auVar126 | ~auVar126 & auVar93;
              auVar92 = auVar93 & auVar126 | ~auVar126 & auVar66;
              auVar144._0_4_ = -(uint)(iVar26 < iVar9);
              auVar144._4_4_ = -(uint)(iVar26 < iVar9);
              auVar144._8_4_ = -(uint)(iVar26 < iVar9);
              auVar144._12_4_ = -(uint)(iVar26 < iVar9);
              auVar127 = auVar109 & auVar144 | ~auVar144 & auVar135;
              auVar145 = ~auVar144 & auVar109 | auVar135 & auVar144;
              auVar111._8_4_ = -(uint)(auVar92._8_4_ < auVar145._8_4_);
              auVar111._4_4_ = auVar111._8_4_;
              auVar111._0_4_ = auVar111._8_4_;
              auVar111._12_4_ = auVar111._8_4_;
              auVar136 = auVar92 & auVar111 | ~auVar111 & auVar145;
              auVar94._8_4_ = -(uint)(auVar65._8_4_ < auVar127._8_4_);
              auVar94._0_8_ = CONCAT44(auVar94._8_4_,auVar94._8_4_);
              auVar94._12_4_ = auVar94._8_4_;
              auVar110 = ~auVar94 & auVar65 | auVar127 & auVar94;
              auVar68._8_4_ = -(uint)(auVar110._8_4_ < auVar136._8_4_);
              auVar68._4_4_ = auVar68._8_4_;
              auVar68._0_4_ = auVar68._8_4_;
              auVar68._12_4_ = auVar68._8_4_;
              *pSVar29 = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar111 & auVar92 | auVar145 & auVar111);
              pSVar29[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (~auVar68 & auVar110 | auVar136 & auVar68);
              pSVar29[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (auVar110 & auVar68 | ~auVar68 & auVar136);
              pSVar29 = pSVar29 + 3;
              uVar10 = auVar65._0_8_ & auVar94._0_8_ | ~auVar94._0_8_ & auVar127._0_8_;
              fVar148 = local_1188;
              fVar152 = fStack_1184;
              fVar64 = fStack_1180;
              fVar88 = fStack_117c;
              fVar150 = local_1198;
              fVar173 = fStack_1194;
              fVar176 = fStack_1190;
              fVar179 = fStack_118c;
            }
          }
        }
      }
      local_11b0 = (ulong)((uint)uVar10 & 0xf) - 8;
      if (local_11b0 != 0) {
        local_11a8 = 0;
        do {
          pSVar37 = context->scene;
          puVar1 = (uint *)((uVar10 & 0xfffffffffffffff0) + local_11a8 * 0x60);
          puVar38 = puVar1 + 0x10;
          ppfVar12 = (pSVar37->vertices).items;
          pfVar13 = ppfVar12[*puVar38];
          uVar21 = *(undefined8 *)(pfVar13 + puVar1[4]);
          uVar22 = *(undefined8 *)(pfVar13 + puVar1[4] + 2);
          local_1428 = (float)uVar21;
          fStack_1424 = (float)((ulong)uVar21 >> 0x20);
          fStack_1420 = (float)uVar22;
          fStack_141c = (float)((ulong)uVar22 >> 0x20);
          fVar172 = pfVar13[(ulong)puVar1[8] + 2];
          pfVar8 = pfVar13 + puVar1[0xc];
          pfVar14 = ppfVar12[puVar1[0x11]];
          pfVar2 = pfVar14 + puVar1[5];
          fVar148 = pfVar2[2];
          fVar152 = pfVar14[(ulong)puVar1[9] + 2];
          pfVar3 = pfVar14 + puVar1[0xd];
          pfVar15 = ppfVar12[puVar1[0x12]];
          pfVar4 = pfVar15 + puVar1[6];
          pfVar5 = pfVar15 + puVar1[0xe];
          pfVar16 = ppfVar12[puVar1[0x13]];
          pfVar6 = pfVar16 + puVar1[7];
          pfVar7 = pfVar16 + puVar1[0xf];
          local_11c8 = pfVar13[(ulong)puVar1[8] + 1];
          fStack_11c4 = pfVar14[(ulong)puVar1[9] + 1];
          fStack_11c0 = pfVar15[(ulong)puVar1[10] + 1];
          fStack_11bc = pfVar16[(ulong)puVar1[0xb] + 1];
          fVar91 = *(float *)(ray + k * 4);
          fVar89 = *(float *)(ray + k * 4 + 0x10);
          fVar122 = pfVar4[2] - fVar91;
          fVar131 = pfVar6[2] - fVar91;
          fVar133 = fStack_1410 - fVar91;
          fVar134 = fStack_140c - fVar91;
          local_11e8 = local_1428;
          fStack_11e4 = *pfVar2;
          local_11d8._4_4_ = *pfVar6;
          local_11d8._0_4_ = *pfVar4;
          local_1428 = local_1428 - fVar91;
          fVar151 = *pfVar2 - fVar91;
          fVar185 = *pfVar4 - fVar91;
          fVar153 = *pfVar6 - fVar91;
          local_f88 = CONCAT44(*pfVar3,*pfVar8);
          stack[0].ptr.ptr._4_4_ = *pfVar7;
          stack[0].ptr.ptr._0_4_ = *pfVar5;
          fVar64 = *pfVar8 - fVar91;
          fVar88 = *pfVar3 - fVar91;
          fVar150 = *pfVar5 - fVar91;
          fVar91 = *pfVar7 - fVar91;
          fStack_12fc = *(float *)(ray + k * 4 + 0x20);
          local_f98 = pfVar13[(ulong)*puVar1 + 1] - fVar89;
          fStack_f94 = pfVar14[(ulong)puVar1[1] + 1] - fVar89;
          fStack_f90 = pfVar15[(ulong)puVar1[2] + 1] - fVar89;
          fStack_f8c = pfVar16[(ulong)puVar1[3] + 1] - fVar89;
          fVar154 = pfVar13[(ulong)*puVar1 + 2] - fStack_12fc;
          fVar156 = pfVar14[(ulong)puVar1[1] + 2] - fStack_12fc;
          fVar158 = pfVar15[(ulong)puVar1[2] + 2] - fStack_12fc;
          fVar160 = pfVar16[(ulong)puVar1[3] + 2] - fStack_12fc;
          local_1018 = pfVar8[1];
          fStack_1014 = pfVar3[1];
          fStack_1010 = pfVar5[1];
          fStack_100c = pfVar7[1];
          local_1368 = pfVar8[1] - fVar89;
          fStack_1364 = pfVar3[1] - fVar89;
          fStack_1360 = pfVar5[1] - fVar89;
          fStack_135c = pfVar7[1] - fVar89;
          local_ff8 = pfVar8[2];
          fStack_ff4 = pfVar3[2];
          fStack_ff0 = pfVar5[2];
          fStack_fec = pfVar7[2];
          fVar173 = pfVar8[2] - fStack_12fc;
          fVar176 = pfVar3[2] - fStack_12fc;
          fVar179 = pfVar5[2] - fStack_12fc;
          fVar182 = pfVar7[2] - fStack_12fc;
          local_fa8 = fVar64 - fVar122;
          fStack_fa4 = fVar88 - fVar131;
          fStack_fa0 = fVar150 - fVar133;
          fStack_f9c = fVar91 - fVar134;
          local_fc8 = local_1368 - local_f98;
          fStack_fc4 = fStack_1364 - fStack_f94;
          fStack_fc0 = fStack_1360 - fStack_f90;
          fStack_fbc = fStack_135c - fStack_f8c;
          local_fb8 = fVar173 - fVar154;
          fStack_fb4 = fVar176 - fVar156;
          fStack_fb0 = fVar179 - fVar158;
          fStack_fac = fVar182 - fVar160;
          fVar90 = *(float *)(ray + k * 4 + 0x50);
          fVar163 = *(float *)(ray + k * 4 + 0x60);
          fVar167 = *(float *)(ray + k * 4 + 0x40);
          fVar123 = (local_fc8 * (fVar173 + fVar154) - (local_1368 + local_f98) * local_fb8) *
                    fVar167 + ((fVar64 + fVar122) * local_fb8 - (fVar173 + fVar154) * local_fa8) *
                              fVar90 + (local_fa8 * (local_1368 + local_f98) -
                                       (fVar64 + fVar122) * local_fc8) * fVar163;
          fVar132 = (fStack_fc4 * (fVar176 + fVar156) - (fStack_1364 + fStack_f94) * fStack_fb4) *
                    fVar167 + ((fVar88 + fVar131) * fStack_fb4 - (fVar176 + fVar156) * fStack_fa4) *
                              fVar90 + (fStack_fa4 * (fStack_1364 + fStack_f94) -
                                       (fVar88 + fVar131) * fStack_fc4) * fVar163;
          tNear.field_0._0_8_ = CONCAT44(fVar132,fVar123);
          tNear.field_0.v[2] =
               (fStack_fc0 * (fVar179 + fVar158) - (fStack_1360 + fStack_f90) * fStack_fb0) *
               fVar167 + ((fVar150 + fVar133) * fStack_fb0 - (fVar179 + fVar158) * fStack_fa0) *
                         fVar90 + (fStack_fa0 * (fStack_1360 + fStack_f90) -
                                  (fVar150 + fVar133) * fStack_fc0) * fVar163;
          tNear.field_0.v[3] =
               (fStack_fbc * (fVar182 + fVar160) - (fStack_135c + fStack_f8c) * fStack_fac) *
               fVar167 + ((fVar91 + fVar134) * fStack_fac - (fVar182 + fVar160) * fStack_f9c) *
                         fVar90 + (fStack_f9c * (fStack_135c + fStack_f8c) -
                                  (fVar91 + fVar134) * fStack_fbc) * fVar163;
          local_1008 = fStack_1424;
          fStack_1004 = pfVar2[1];
          fStack_1000 = pfVar4[1];
          fStack_ffc = pfVar6[1];
          local_11f8 = fVar89;
          fStack_11f4 = fVar89;
          fStack_11f0 = fVar89;
          fStack_11ec = fVar89;
          local_1208 = fStack_1424 - fVar89;
          fStack_1204 = pfVar2[1] - fVar89;
          fStack_1200 = pfVar4[1] - fVar89;
          fStack_11fc = pfVar6[1] - fVar89;
          local_1338 = fStack_1420 - fStack_12fc;
          fStack_1334 = fVar148 - fStack_12fc;
          fStack_1330 = fStack_1420 - fStack_12fc;
          fStack_132c = fStack_141c - fStack_12fc;
          fVar174 = fVar122 - local_1428;
          fVar177 = fVar131 - fVar151;
          fVar180 = fVar133 - fVar185;
          fVar183 = fVar134 - fVar153;
          fVar106 = local_f98 - local_1208;
          fVar119 = fStack_f94 - fStack_1204;
          fVar120 = fStack_f90 - fStack_1200;
          fVar121 = fStack_f8c - fStack_11fc;
          local_fd8 = fVar154 - local_1338;
          fStack_fd4 = fVar156 - fStack_1334;
          fStack_fd0 = fVar158 - fStack_1330;
          fStack_fcc = fVar160 - fStack_132c;
          local_1028._0_4_ =
               (fVar106 * (fVar154 + local_1338) - (local_f98 + local_1208) * local_fd8) * fVar167 +
               ((fVar122 + local_1428) * local_fd8 - (fVar154 + local_1338) * fVar174) * fVar90 +
               (fVar174 * (local_f98 + local_1208) - (fVar122 + local_1428) * fVar106) * fVar163;
          local_1028._4_4_ =
               (fVar119 * (fVar156 + fStack_1334) - (fStack_f94 + fStack_1204) * fStack_fd4) *
               fVar167 + ((fVar131 + fVar151) * fStack_fd4 - (fVar156 + fStack_1334) * fVar177) *
                         fVar90 + (fVar177 * (fStack_f94 + fStack_1204) -
                                  (fVar131 + fVar151) * fVar119) * fVar163;
          local_1028._8_4_ =
               (fVar120 * (fVar158 + fStack_1330) - (fStack_f90 + fStack_1200) * fStack_fd0) *
               fVar167 + ((fVar133 + fVar185) * fStack_fd0 - (fVar158 + fStack_1330) * fVar180) *
                         fVar90 + (fVar180 * (fStack_f90 + fStack_1200) -
                                  (fVar133 + fVar185) * fVar120) * fVar163;
          local_1028._12_4_ =
               (fVar121 * (fVar160 + fStack_132c) - (fStack_f8c + fStack_11fc) * fStack_fcc) *
               fVar167 + ((fVar134 + fVar153) * fStack_fcc - (fVar160 + fStack_132c) * fVar183) *
                         fVar90 + (fVar183 * (fStack_f8c + fStack_11fc) -
                                  (fVar134 + fVar153) * fVar121) * fVar163;
          fVar155 = local_1428 - fVar64;
          fVar157 = fVar151 - fVar88;
          fVar159 = fVar185 - fVar150;
          fVar161 = fVar153 - fVar91;
          local_fe8 = local_1208 - local_1368;
          fStack_fe4 = fStack_1204 - fStack_1364;
          fStack_fe0 = fStack_1200 - fStack_1360;
          fStack_fdc = fStack_11fc - fStack_135c;
          fVar186 = local_1338 - fVar173;
          fVar187 = fStack_1334 - fVar176;
          fVar188 = fStack_1330 - fVar179;
          fVar189 = fStack_132c - fVar182;
          local_1328 = local_1208 + local_1368;
          fStack_1324 = fStack_1204 + fStack_1364;
          fStack_1320 = fStack_1200 + fStack_1360;
          fStack_131c = fStack_11fc + fStack_135c;
          local_1318 = local_1338 + fVar173;
          fStack_1314 = fStack_1334 + fVar176;
          fStack_1310 = fStack_1330 + fVar179;
          fStack_130c = fStack_132c + fVar182;
          auVar52._0_4_ =
               (local_fe8 * local_1318 - local_1328 * fVar186) * fVar167 +
               ((fVar64 + local_1428) * fVar186 - fVar155 * local_1318) * fVar90 +
               (fVar155 * local_1328 - (fVar64 + local_1428) * local_fe8) * fVar163;
          auVar52._4_4_ =
               (fStack_fe4 * fStack_1314 - fStack_1324 * fVar187) * fVar167 +
               ((fVar88 + fVar151) * fVar187 - fVar157 * fStack_1314) * fVar90 +
               (fVar157 * fStack_1324 - (fVar88 + fVar151) * fStack_fe4) * fVar163;
          auVar52._8_4_ =
               (fStack_fe0 * fStack_1310 - fStack_1320 * fVar188) * fVar167 +
               ((fVar150 + fVar185) * fVar188 - fVar159 * fStack_1310) * fVar90 +
               (fVar159 * fStack_1320 - (fVar150 + fVar185) * fStack_fe0) * fVar163;
          auVar52._12_4_ =
               (fStack_fdc * fStack_130c - fStack_131c * fVar189) * fVar167 +
               ((fVar91 + fVar153) * fVar189 - fVar161 * fStack_130c) * fVar90 +
               (fVar161 * fStack_131c - (fVar91 + fVar153) * fStack_fdc) * fVar163;
          fVar151 = fVar123 + local_1028._0_4_ + auVar52._0_4_;
          fVar185 = fVar132 + local_1028._4_4_ + auVar52._4_4_;
          fVar153 = tNear.field_0.v[2] + local_1028._8_4_ + auVar52._8_4_;
          fVar147 = tNear.field_0.v[3] + local_1028._12_4_ + auVar52._12_4_;
          auVar137._8_4_ = tNear.field_0.i[2];
          auVar137._0_8_ = tNear.field_0._0_8_;
          auVar137._12_4_ = tNear.field_0.i[3];
          auVar138 = minps(auVar137,local_1028);
          auVar138 = minps(auVar138,auVar52);
          auVar164._8_4_ = tNear.field_0.i[2];
          auVar164._0_8_ = tNear.field_0._0_8_;
          auVar164._12_4_ = tNear.field_0.i[3];
          auVar165 = maxps(auVar164,local_1028);
          auVar165 = maxps(auVar165,auVar52);
          fVar91 = ABS(fVar151) * 1.1920929e-07;
          fVar64 = ABS(fVar185) * 1.1920929e-07;
          fVar88 = ABS(fVar153) * 1.1920929e-07;
          fVar150 = ABS(fVar147) * 1.1920929e-07;
          auVar166._4_4_ = -(uint)(auVar165._4_4_ <= fVar64);
          auVar166._0_4_ = -(uint)(auVar165._0_4_ <= fVar91);
          auVar166._8_4_ = -(uint)(auVar165._8_4_ <= fVar88);
          auVar166._12_4_ = -(uint)(auVar165._12_4_ <= fVar150);
          auVar139._4_4_ = -(uint)(-fVar64 <= auVar138._4_4_);
          auVar139._0_4_ = -(uint)(-fVar91 <= auVar138._0_4_);
          auVar139._8_4_ = -(uint)(-fVar88 <= auVar138._8_4_);
          auVar139._12_4_ = -(uint)(-fVar150 <= auVar138._12_4_);
          auVar166 = auVar166 | auVar139;
          lVar30 = local_11a8 * 0x60 + (uVar10 & 0xfffffffffffffff0);
          uVar28 = (undefined4)((ulong)lVar30 >> 0x20);
          iVar26 = movmskps((int)lVar30,auVar166);
          scene = pSVar37;
          if (iVar26 == 0) {
            uVar34 = 0;
LAB_001f5c9c:
            auVar99._4_4_ = fStack_1204;
            auVar99._0_4_ = local_1208;
            auVar99._8_4_ = fStack_1200;
            auVar99._12_4_ = fStack_11fc;
          }
          else {
            local_1038 = fVar151;
            fStack_1034 = fVar185;
            fStack_1030 = fVar153;
            fStack_102c = fVar147;
            uVar34 = -(uint)(ABS(local_fe8 * local_fd8) <= ABS(fVar106 * local_fb8));
            uVar43 = -(uint)(ABS(fStack_fe4 * fStack_fd4) <= ABS(fVar119 * fStack_fb4));
            uVar46 = -(uint)(ABS(fStack_fe0 * fStack_fd0) <= ABS(fVar120 * fStack_fb0));
            uVar49 = -(uint)(ABS(fStack_fdc * fStack_fcc) <= ABS(fVar121 * fStack_fac));
            uVar41 = -(uint)(ABS(fVar174 * fVar186) <= ABS(local_fa8 * local_fd8));
            uVar44 = -(uint)(ABS(fVar177 * fVar187) <= ABS(fStack_fa4 * fStack_fd4));
            uVar47 = -(uint)(ABS(fVar180 * fVar188) <= ABS(fStack_fa0 * fStack_fd0));
            uVar50 = -(uint)(ABS(fVar183 * fVar189) <= ABS(fStack_f9c * fStack_fcc));
            uVar42 = -(uint)(ABS(fVar155 * fVar106) <= ABS(fVar174 * local_fc8));
            uVar45 = -(uint)(ABS(fVar157 * fVar119) <= ABS(fVar177 * fStack_fc4));
            uVar48 = -(uint)(ABS(fVar159 * fVar120) <= ABS(fVar180 * fStack_fc0));
            uVar51 = -(uint)(ABS(fVar161 * fVar121) <= ABS(fVar183 * fStack_fbc));
            local_1258[0] =
                 (float)(~uVar34 & (uint)(local_fc8 * local_fd8 - fVar106 * local_fb8) |
                        (uint)(fVar106 * fVar186 - local_fe8 * local_fd8) & uVar34);
            local_1258[1] =
                 (float)(~uVar43 & (uint)(fStack_fc4 * fStack_fd4 - fVar119 * fStack_fb4) |
                        (uint)(fVar119 * fVar187 - fStack_fe4 * fStack_fd4) & uVar43);
            local_1258[2] =
                 (float)(~uVar46 & (uint)(fStack_fc0 * fStack_fd0 - fVar120 * fStack_fb0) |
                        (uint)(fVar120 * fVar188 - fStack_fe0 * fStack_fd0) & uVar46);
            local_1258[3] =
                 (float)(~uVar49 & (uint)(fStack_fbc * fStack_fcc - fVar121 * fStack_fac) |
                        (uint)(fVar121 * fVar189 - fStack_fdc * fStack_fcc) & uVar49);
            auVar140._0_4_ = ~uVar41 & (uint)(local_fb8 * fVar174 - local_fa8 * local_fd8);
            auVar140._4_4_ = ~uVar44 & (uint)(fStack_fb4 * fVar177 - fStack_fa4 * fStack_fd4);
            auVar140._8_4_ = ~uVar47 & (uint)(fStack_fb0 * fVar180 - fStack_fa0 * fStack_fd0);
            auVar140._12_4_ = ~uVar50 & (uint)(fStack_fac * fVar183 - fStack_f9c * fStack_fcc);
            auVar18._4_4_ = (uint)(fVar157 * fStack_fd4 - fVar177 * fVar187) & uVar44;
            auVar18._0_4_ = (uint)(fVar155 * local_fd8 - fVar174 * fVar186) & uVar41;
            auVar18._8_4_ = (uint)(fVar159 * fStack_fd0 - fVar180 * fVar188) & uVar47;
            auVar18._12_4_ = (uint)(fVar161 * fStack_fcc - fVar183 * fVar189) & uVar50;
            _local_1248 = auVar140 | auVar18;
            local_1238[0] =
                 (float)(~uVar42 & (uint)(local_fa8 * fVar106 - fVar174 * local_fc8) |
                        (uint)(fVar174 * local_fe8 - fVar155 * fVar106) & uVar42);
            local_1238[1] =
                 (float)(~uVar45 & (uint)(fStack_fa4 * fVar119 - fVar177 * fStack_fc4) |
                        (uint)(fVar177 * fStack_fe4 - fVar157 * fVar119) & uVar45);
            local_1238[2] =
                 (float)(~uVar48 & (uint)(fStack_fa0 * fVar120 - fVar180 * fStack_fc0) |
                        (uint)(fVar180 * fStack_fe0 - fVar159 * fVar120) & uVar48);
            local_1238[3] =
                 (float)(~uVar51 & (uint)(fStack_f9c * fVar121 - fVar183 * fStack_fbc) |
                        (uint)(fVar183 * fStack_fdc - fVar161 * fVar121) & uVar51);
            fVar91 = fVar167 * local_1258[0] + fVar90 * local_1248._0_4_ + fVar163 * local_1238[0];
            fVar64 = fVar167 * local_1258[1] + fVar90 * local_1248._4_4_ + fVar163 * local_1238[1];
            fVar88 = fVar167 * local_1258[2] + fVar90 * local_1248._8_4_ + fVar163 * local_1238[2];
            fVar150 = fVar167 * local_1258[3] + fVar90 * local_1248._12_4_ + fVar163 * local_1238[3]
            ;
            auVar95._0_4_ = fVar91 + fVar91;
            auVar95._4_4_ = fVar64 + fVar64;
            auVar95._8_4_ = fVar88 + fVar88;
            auVar95._12_4_ = fVar150 + fVar150;
            auVar53._0_4_ = fVar154 * local_1238[0];
            auVar53._4_4_ = fVar156 * local_1238[1];
            auVar53._8_4_ = fVar158 * local_1238[2];
            auVar53._12_4_ = fVar160 * local_1238[3];
            fVar106 = fVar122 * local_1258[0] + local_f98 * local_1248._0_4_ + auVar53._0_4_;
            fVar119 = fVar131 * local_1258[1] + fStack_f94 * local_1248._4_4_ + auVar53._4_4_;
            fVar120 = fVar133 * local_1258[2] + fStack_f90 * local_1248._8_4_ + auVar53._8_4_;
            fVar121 = fVar134 * local_1258[3] + fStack_f8c * local_1248._12_4_ + auVar53._12_4_;
            auVar138 = rcpps(auVar53,auVar95);
            fVar91 = auVar138._0_4_;
            fVar64 = auVar138._4_4_;
            fVar88 = auVar138._8_4_;
            fVar150 = auVar138._12_4_;
            fVar106 = ((1.0 - auVar95._0_4_ * fVar91) * fVar91 + fVar91) * (fVar106 + fVar106);
            fVar119 = ((1.0 - auVar95._4_4_ * fVar64) * fVar64 + fVar64) * (fVar119 + fVar119);
            fVar88 = ((1.0 - auVar95._8_4_ * fVar88) * fVar88 + fVar88) * (fVar120 + fVar120);
            fVar150 = ((1.0 - auVar95._12_4_ * fVar150) * fVar150 + fVar150) * (fVar121 + fVar121);
            fVar91 = *(float *)(ray + k * 4 + 0x80);
            local_13e8 = ZEXT416((uint)fVar91);
            fVar64 = *(float *)(ray + k * 4 + 0x30);
            auVar54._0_4_ = -(uint)(fVar106 <= fVar91 && fVar64 <= fVar106) & auVar166._0_4_;
            auVar54._4_4_ = -(uint)(fVar119 <= fVar91 && fVar64 <= fVar119) & auVar166._4_4_;
            auVar54._8_4_ = -(uint)(fVar88 <= fVar91 && fVar64 <= fVar88) & auVar166._8_4_;
            auVar54._12_4_ = -(uint)(fVar150 <= fVar91 && fVar64 <= fVar150) & auVar166._12_4_;
            uVar34 = movmskps(iVar26,auVar54);
            if (uVar34 == 0) goto LAB_001f5c9c;
            valid.field_0.i[0] = auVar54._0_4_ & -(uint)(auVar95._0_4_ != 0.0);
            valid.field_0.i[1] = auVar54._4_4_ & -(uint)(auVar95._4_4_ != 0.0);
            valid.field_0.i[2] = auVar54._8_4_ & -(uint)(auVar95._8_4_ != 0.0);
            valid.field_0.i[3] = auVar54._12_4_ & -(uint)(auVar95._12_4_ != 0.0);
            uVar34 = movmskps(uVar34,(undefined1  [16])valid.field_0);
            auVar99._4_4_ = fStack_1204;
            auVar99._0_4_ = local_1208;
            auVar99._8_4_ = fStack_1200;
            auVar99._12_4_ = fStack_11fc;
            if (uVar34 != 0) {
              auVar24._4_4_ = fVar185;
              auVar24._0_4_ = fVar151;
              auVar24._8_4_ = fVar153;
              auVar24._12_4_ = fVar147;
              local_1268[0] = fVar106;
              local_1268[1] = fVar119;
              local_1268[2] = fVar88;
              local_1268[3] = fVar150;
              local_1228 = local_1048._0_4_;
              uStack_1224 = local_1048._4_4_;
              uStack_1220 = local_1048._8_4_;
              uStack_121c = local_1048._12_4_;
              auVar138 = rcpps(auVar99,auVar24);
              fVar91 = auVar138._0_4_;
              fVar89 = auVar138._4_4_;
              fVar90 = auVar138._8_4_;
              fVar163 = auVar138._12_4_;
              fVar120 = DAT_01f7ba10._4_4_;
              fVar121 = DAT_01f7ba10._12_4_;
              fVar167 = (float)DAT_01f7ba10;
              fVar64 = DAT_01f7ba10._8_4_;
              fVar91 = (float)(-(uint)(1e-18 <= ABS(fVar151)) &
                              (uint)((fVar167 - fVar151 * fVar91) * fVar91 + fVar91));
              fVar89 = (float)(-(uint)(1e-18 <= ABS(fVar185)) &
                              (uint)((fVar120 - fVar185 * fVar89) * fVar89 + fVar89));
              fVar90 = (float)(-(uint)(1e-18 <= ABS(fVar153)) &
                              (uint)((fVar64 - fVar153 * fVar90) * fVar90 + fVar90));
              fVar163 = (float)(-(uint)(1e-18 <= ABS(fVar147)) &
                               (uint)((fVar121 - fVar147 * fVar163) * fVar163 + fVar163));
              auVar128._0_4_ = fVar123 * fVar91;
              auVar128._4_4_ = fVar132 * fVar89;
              auVar128._8_4_ = tNear.field_0.v[2] * fVar90;
              auVar128._12_4_ = tNear.field_0.v[3] * fVar163;
              auVar165 = minps(auVar128,_DAT_01f7ba10);
              auVar69._0_4_ = fVar91 * local_1028._0_4_;
              auVar69._4_4_ = fVar89 * local_1028._4_4_;
              auVar69._8_4_ = fVar90 * local_1028._8_4_;
              auVar69._12_4_ = fVar163 * local_1028._12_4_;
              auVar138 = minps(auVar69,_DAT_01f7ba10);
              auVar96._0_4_ = (uint)(fVar167 - auVar165._0_4_) & local_1048._0_4_;
              auVar96._4_4_ = (uint)(fVar120 - auVar165._4_4_) & local_1048._4_4_;
              auVar96._8_4_ = (uint)(fVar64 - auVar165._8_4_) & local_1048._8_4_;
              auVar96._12_4_ = (uint)(fVar121 - auVar165._12_4_) & local_1048._12_4_;
              auVar129._0_4_ = (uint)auVar165._0_4_ & local_1068._0_4_;
              auVar129._4_4_ = (uint)auVar165._4_4_ & local_1068._4_4_;
              auVar129._8_4_ = (uint)auVar165._8_4_ & local_1068._8_4_;
              auVar129._12_4_ = (uint)auVar165._12_4_ & local_1068._12_4_;
              local_1288 = auVar129 | auVar96;
              local_1278._4_4_ =
                   (uint)auVar138._4_4_ & local_1068._4_4_ |
                   (uint)(fVar120 - auVar138._4_4_) & local_1048._4_4_;
              local_1278._0_4_ =
                   (uint)auVar138._0_4_ & local_1068._0_4_ |
                   (uint)(fVar167 - auVar138._0_4_) & local_1048._0_4_;
              local_1278._8_4_ =
                   (uint)auVar138._8_4_ & local_1068._8_4_ |
                   (uint)(fVar64 - auVar138._8_4_) & local_1048._8_4_;
              local_1278._12_4_ =
                   (uint)auVar138._12_4_ & local_1068._12_4_ |
                   (uint)(fVar121 - auVar138._12_4_) & local_1048._12_4_;
              auVar70._0_4_ = (uint)fVar106 & valid.field_0.i[0];
              auVar70._4_4_ = (uint)fVar119 & valid.field_0.i[1];
              auVar70._8_4_ = (uint)fVar88 & valid.field_0.i[2];
              auVar70._12_4_ = (uint)fVar150 & valid.field_0.i[3];
              auVar97._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000
              ;
              auVar97._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
              auVar97._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
              auVar97 = auVar97 | auVar70;
              auVar112._4_4_ = auVar97._0_4_;
              auVar112._0_4_ = auVar97._4_4_;
              auVar112._8_4_ = auVar97._12_4_;
              auVar112._12_4_ = auVar97._8_4_;
              auVar138 = minps(auVar112,auVar97);
              auVar71._0_8_ = auVar138._8_8_;
              auVar71._8_4_ = auVar138._0_4_;
              auVar71._12_4_ = auVar138._4_4_;
              auVar138 = minps(auVar71,auVar138);
              auVar72._0_8_ =
                   CONCAT44(-(uint)(auVar138._4_4_ == auVar97._4_4_) & valid.field_0.i[1],
                            -(uint)(auVar138._0_4_ == auVar97._0_4_) & valid.field_0.i[0]);
              auVar72._8_4_ = -(uint)(auVar138._8_4_ == auVar97._8_4_) & valid.field_0.i[2];
              auVar72._12_4_ = -(uint)(auVar138._12_4_ == auVar97._12_4_) & valid.field_0.i[3];
              iVar26 = movmskps(uVar34,auVar72);
              aVar55 = valid.field_0;
              if (iVar26 != 0) {
                aVar55.i[2] = auVar72._8_4_;
                aVar55._0_8_ = auVar72._0_8_;
                aVar55.i[3] = auVar72._12_4_;
              }
              uVar27 = movmskps(iVar26,(undefined1  [16])aVar55);
              lVar39 = 0;
              local_13a8 = fVar173;
              fStack_13a4 = fVar176;
              fStack_13a0 = fVar179;
              fStack_139c = fVar182;
              if (CONCAT44(uVar28,uVar27) != 0) {
                for (; (CONCAT44(uVar28,uVar27) >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                }
              }
LAB_001f4c9f:
              uVar34 = puVar38[lVar39];
              uVar33 = (ulong)uVar34;
              pGVar17 = (pSVar37->geometries).items[uVar33].ptr;
              if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar39] = 0.0;
LAB_001f502e:
                uVar28 = (undefined4)(uVar33 >> 0x20);
                uVar34 = movmskps((int)uVar33,(undefined1  [16])valid.field_0);
                if (uVar34 == 0) goto LAB_001f5186;
                uVar41 = valid.field_0._0_4_;
                uVar42 = valid.field_0._4_4_;
                uVar43 = valid.field_0._8_4_;
                uVar44 = valid.field_0._12_4_;
                auVar74._0_4_ = uVar41 & (uint)fVar106;
                auVar74._4_4_ = uVar42 & (uint)fVar119;
                auVar74._8_4_ = uVar43 & (uint)fVar88;
                auVar74._12_4_ = uVar44 & (uint)fVar150;
                auVar98._0_8_ = CONCAT44(~uVar42,~uVar41) & 0x7f8000007f800000;
                auVar98._8_4_ = ~uVar43 & 0x7f800000;
                auVar98._12_4_ = ~uVar44 & 0x7f800000;
                auVar98 = auVar98 | auVar74;
                auVar113._4_4_ = auVar98._0_4_;
                auVar113._0_4_ = auVar98._4_4_;
                auVar113._8_4_ = auVar98._12_4_;
                auVar113._12_4_ = auVar98._8_4_;
                auVar138 = minps(auVar113,auVar98);
                auVar75._0_8_ = auVar138._8_8_;
                auVar75._8_4_ = auVar138._0_4_;
                auVar75._12_4_ = auVar138._4_4_;
                auVar138 = minps(auVar75,auVar138);
                auVar76._0_8_ =
                     CONCAT44(-(uint)(auVar138._4_4_ == auVar98._4_4_) & uVar42,
                              -(uint)(auVar138._0_4_ == auVar98._0_4_) & uVar41);
                auVar76._8_4_ = -(uint)(auVar138._8_4_ == auVar98._8_4_) & uVar43;
                auVar76._12_4_ = -(uint)(auVar138._12_4_ == auVar98._12_4_) & uVar44;
                iVar26 = movmskps(uVar34,auVar76);
                aVar57 = valid.field_0;
                if (iVar26 != 0) {
                  aVar57.i[2] = auVar76._8_4_;
                  aVar57._0_8_ = auVar76._0_8_;
                  aVar57.i[3] = auVar76._12_4_;
                }
                uVar27 = movmskps(iVar26,(undefined1  [16])aVar57);
                lVar39 = 0;
                if (CONCAT44(uVar28,uVar27) != 0) {
                  for (; (CONCAT44(uVar28,uVar27) >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                  }
                }
                goto LAB_001f4c9f;
              }
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_1148 = *(undefined4 *)(local_1288 + lVar39 * 4);
                local_1138 = local_1268[lVar39 + -4];
                local_1178._4_4_ = local_1258[lVar39];
                local_1168._4_4_ = local_1238[lVar39 + -4];
                local_1118._4_4_ = uVar34;
                local_1118._0_4_ = uVar34;
                local_1118._8_4_ = uVar34;
                local_1118._12_4_ = uVar34;
                uVar28 = *(undefined4 *)(lVar30 + 0x50 + lVar39 * 4);
                local_1128._4_4_ = uVar28;
                local_1128._0_4_ = uVar28;
                local_1128._8_4_ = uVar28;
                local_1128._12_4_ = uVar28;
                local_1158._4_4_ = local_1238[lVar39];
                local_1178._0_4_ = local_1178._4_4_;
                fStack_1170 = (float)local_1178._4_4_;
                fStack_116c = (float)local_1178._4_4_;
                local_1168._0_4_ = local_1168._4_4_;
                fStack_1160 = (float)local_1168._4_4_;
                fStack_115c = (float)local_1168._4_4_;
                local_1158._0_4_ = local_1158._4_4_;
                fStack_1150 = (float)local_1158._4_4_;
                fStack_114c = (float)local_1158._4_4_;
                uStack_1144 = local_1148;
                uStack_1140 = local_1148;
                uStack_113c = local_1148;
                fStack_1134 = local_1138;
                fStack_1130 = local_1138;
                fStack_112c = local_1138;
                local_1108 = context->user->instID[0];
                uStack_1104 = local_1108;
                uStack_1100 = local_1108;
                uStack_10fc = local_1108;
                local_10f8 = context->user->instPrimID[0];
                uStack_10f4 = local_10f8;
                uStack_10f0 = local_10f8;
                uStack_10ec = local_10f8;
                *(float *)(ray + k * 4 + 0x80) = local_1268[lVar39];
                local_13c8 = *(undefined1 (*) [16])
                              (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                args.valid = (int *)local_13c8;
                args.geometryUserPtr = pGVar17->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_1178;
                args.N = 4;
                p_Var31 = pGVar17->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (p_Var31 != (RTCFilterFunctionN)0x0) {
                  p_Var31 = (RTCFilterFunctionN)(*p_Var31)(&args);
                  pSVar37 = scene;
                }
                auVar73._0_4_ = -(uint)(local_13c8._0_4_ == 0);
                auVar73._4_4_ = -(uint)(local_13c8._4_4_ == 0);
                auVar73._8_4_ = -(uint)(local_13c8._8_4_ == 0);
                auVar73._12_4_ = -(uint)(local_13c8._12_4_ == 0);
                uVar34 = movmskps((int)p_Var31,auVar73);
                pRVar32 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
                if ((uVar34 ^ 0xf) == 0) {
                  auVar73 = auVar73 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var31 = context->args->filter;
                  if ((p_Var31 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar17->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    p_Var31 = (RTCFilterFunctionN)(*p_Var31)(&args);
                    pSVar37 = scene;
                  }
                  auVar56._0_4_ = -(uint)(local_13c8._0_4_ == 0);
                  auVar56._4_4_ = -(uint)(local_13c8._4_4_ == 0);
                  auVar56._8_4_ = -(uint)(local_13c8._8_4_ == 0);
                  auVar56._12_4_ = -(uint)(local_13c8._12_4_ == 0);
                  auVar73 = auVar56 ^ _DAT_01f7ae20;
                  uVar34 = movmskps((int)p_Var31,auVar56);
                  pRVar32 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
                  if ((uVar34 ^ 0xf) != 0) {
                    uVar34 = *(uint *)(args.hit + 4);
                    uVar41 = *(uint *)(args.hit + 8);
                    uVar42 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~auVar56._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & auVar56._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~auVar56._4_4_ & uVar34 | *(uint *)(args.ray + 0xc4) & auVar56._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~auVar56._8_4_ & uVar41 | *(uint *)(args.ray + 200) & auVar56._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~auVar56._12_4_ & uVar42 | *(uint *)(args.ray + 0xcc) & auVar56._12_4_;
                    uVar34 = *(uint *)(args.hit + 0x14);
                    uVar41 = *(uint *)(args.hit + 0x18);
                    uVar42 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar56._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar56._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar56._4_4_ & uVar34 | *(uint *)(args.ray + 0xd4) & auVar56._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar56._8_4_ & uVar41 | *(uint *)(args.ray + 0xd8) & auVar56._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar56._12_4_ & uVar42 | *(uint *)(args.ray + 0xdc) & auVar56._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0xe0) =
                         ~auVar56 & *(undefined1 (*) [16])(args.hit + 0x20) |
                         *(undefined1 (*) [16])(args.ray + 0xe0) & auVar56;
                    *(undefined1 (*) [16])(args.ray + 0xf0) =
                         ~auVar56 & *(undefined1 (*) [16])(args.hit + 0x30) |
                         *(undefined1 (*) [16])(args.ray + 0xf0) & auVar56;
                    uVar34 = *(uint *)(args.hit + 0x44);
                    uVar41 = *(uint *)(args.hit + 0x48);
                    uVar42 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar56._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar56._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar56._4_4_ & uVar34 | *(uint *)(args.ray + 0x104) & auVar56._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar56._8_4_ & uVar41 | *(uint *)(args.ray + 0x108) & auVar56._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar56._12_4_ & uVar42 | *(uint *)(args.ray + 0x10c) & auVar56._12_4_;
                    uVar34 = *(uint *)(args.hit + 0x54);
                    uVar41 = *(uint *)(args.hit + 0x58);
                    uVar42 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar56._0_4_ |
                         ~auVar56._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar56._4_4_ | ~auVar56._4_4_ & uVar34;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar56._8_4_ | ~auVar56._8_4_ & uVar41;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar56._12_4_ | ~auVar56._12_4_ & uVar42;
                    uVar34 = *(uint *)(args.hit + 100);
                    uVar41 = *(uint *)(args.hit + 0x68);
                    uVar42 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar56._0_4_ |
                         ~auVar56._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar56._4_4_ | ~auVar56._4_4_ & uVar34;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar56._8_4_ | ~auVar56._8_4_ & uVar41;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar56._12_4_ | ~auVar56._12_4_ & uVar42;
                    uVar34 = *(uint *)(args.hit + 0x74);
                    uVar41 = *(uint *)(args.hit + 0x78);
                    uVar42 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar56._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar56._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar56._4_4_ & uVar34 | *(uint *)(args.ray + 0x134) & auVar56._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar56._8_4_ & uVar41 | *(uint *)(args.ray + 0x138) & auVar56._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar56._12_4_ & uVar42 | *(uint *)(args.ray + 0x13c) & auVar56._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x140) =
                         ~auVar56 & *(undefined1 (*) [16])(args.hit + 0x80) |
                         *(undefined1 (*) [16])(args.ray + 0x140) & auVar56;
                    pRVar32 = args.ray;
                  }
                }
                auVar77._0_4_ = auVar73._0_4_ << 0x1f;
                auVar77._4_4_ = auVar73._4_4_ << 0x1f;
                auVar77._8_4_ = auVar73._8_4_ << 0x1f;
                auVar77._12_4_ = auVar73._12_4_ << 0x1f;
                iVar26 = movmskps((int)pRVar32,auVar77);
                uVar33 = CONCAT44((int)((ulong)pRVar32 >> 0x20),iVar26);
                if (iVar26 == 0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_13e8._0_4_;
                }
                else {
                  local_13e8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_13e8._4_4_ = 0;
                  local_13e8._8_4_ = 0;
                  local_13e8._12_4_ = 0;
                }
                valid.field_0.v[lVar39] = 0.0;
                valid.field_0.i[0] =
                     -(uint)(fVar106 <= (float)local_13e8._0_4_) & valid.field_0.i[0];
                valid.field_0.i[1] =
                     -(uint)(fVar119 <= (float)local_13e8._0_4_) & valid.field_0.i[1];
                valid.field_0.i[2] = -(uint)(fVar88 <= (float)local_13e8._0_4_) & valid.field_0.i[2]
                ;
                valid.field_0.i[3] =
                     -(uint)(fVar150 <= (float)local_13e8._0_4_) & valid.field_0.i[3];
                goto LAB_001f502e;
              }
              uVar28 = *(undefined4 *)(local_1288 + lVar39 * 4);
              fVar91 = local_1268[lVar39 + -4];
              *(float *)(ray + k * 4 + 0x80) = local_1268[lVar39];
              *(float *)(ray + k * 4 + 0xc0) = local_1258[lVar39];
              *(float *)(ray + k * 4 + 0xd0) = local_1238[lVar39 + -4];
              *(float *)(ray + k * 4 + 0xe0) = local_1238[lVar39];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar28;
              *(float *)(ray + k * 4 + 0x100) = fVar91;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar30 + 0x50 + lVar39 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar34;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar34 = context->user->instPrimID[0];
              uVar28 = 0;
              *(uint *)(ray + k * 4 + 0x140) = uVar34;
LAB_001f5186:
              fVar89 = *(float *)(ray + k * 4 + 0x10);
              fStack_12fc = *(float *)(ray + k * 4 + 0x20);
              fVar167 = *(float *)(ray + k * 4 + 0x40);
              fVar90 = *(float *)(ray + k * 4 + 0x50);
              fVar163 = *(float *)(ray + k * 4 + 0x60);
              local_1368 = local_1018 - fVar89;
              fStack_1364 = fStack_1014 - fVar89;
              fStack_1360 = fStack_1010 - fVar89;
              fStack_135c = fStack_100c - fVar89;
              fVar173 = local_ff8 - fStack_12fc;
              fVar176 = fStack_ff4 - fStack_12fc;
              fVar179 = fStack_ff0 - fStack_12fc;
              fVar182 = fStack_fec - fStack_12fc;
              auVar99._0_4_ = local_1008 - fVar89;
              auVar99._4_4_ = fStack_1004 - fVar89;
              auVar99._8_4_ = fStack_1000 - fVar89;
              auVar99._12_4_ = fStack_ffc - fVar89;
              local_1338 = fStack_1420 - fStack_12fc;
              fStack_1334 = fVar148 - fStack_12fc;
              fStack_1330 = fStack_1420 - fStack_12fc;
              fStack_132c = fStack_141c - fStack_12fc;
              local_1328 = local_1368 + auVar99._0_4_;
              fStack_1324 = fStack_1364 + auVar99._4_4_;
              fStack_1320 = fStack_1360 + auVar99._8_4_;
              fStack_131c = fStack_135c + auVar99._12_4_;
              fStack_1314 = fVar176 + fStack_1334;
              local_1318 = fVar173 + local_1338;
              fStack_1310 = fVar179 + fStack_1330;
              fStack_130c = fVar182 + fStack_132c;
            }
          }
          fVar172 = fVar172 - fStack_12fc;
          fVar152 = fVar152 - fStack_12fc;
          fStack_1350 = fStack_1350 - fStack_12fc;
          fStack_134c = fStack_134c - fStack_12fc;
          local_11c8 = local_11c8 - fVar89;
          fStack_11c4 = fStack_11c4 - fVar89;
          fStack_11c0 = fStack_11c0 - fVar89;
          fStack_11bc = fStack_11bc - fVar89;
          fVar91 = *(float *)(ray + k * 4);
          fVar185 = (float)local_11d8._0_4_ - fVar91;
          fVar153 = (float)local_11d8._4_4_ - fVar91;
          fVar147 = fStack_11d0 - fVar91;
          fVar154 = fStack_11cc - fVar91;
          fVar168 = (float)local_f88 - fVar91;
          fVar169 = local_f88._4_4_ - fVar91;
          fVar170 = fStack_f80 - fVar91;
          fVar171 = fStack_f7c - fVar91;
          local_11e8 = local_11e8 - fVar91;
          fStack_11e4 = fStack_11e4 - fVar91;
          fVar151 = fStack_11e0 - fVar91;
          fVar91 = fStack_11dc - fVar91;
          local_13a8 = local_11e8 - fVar185;
          fStack_13a4 = fStack_11e4 - fVar153;
          fStack_13a0 = fVar151 - fVar147;
          fStack_139c = fVar91 - fVar154;
          fVar150 = auVar99._0_4_;
          fVar120 = auVar99._4_4_;
          fVar121 = auVar99._8_4_;
          fVar122 = auVar99._12_4_;
          fVar177 = fVar150 - local_11c8;
          fVar183 = fVar120 - fStack_11c4;
          fVar187 = fVar121 - fStack_11c0;
          fVar189 = fVar122 - fStack_11bc;
          fVar155 = local_1338 - fVar172;
          fVar157 = fStack_1334 - fVar152;
          fVar159 = fStack_1330 - fStack_1350;
          fVar161 = fStack_132c - fStack_134c;
          fVar89 = local_1368 - fVar150;
          fVar64 = fStack_1364 - fVar120;
          fVar106 = fStack_1360 - fVar121;
          fVar119 = fStack_135c - fVar122;
          fVar148 = fVar173 - local_1338;
          fVar88 = fVar176 - fStack_1334;
          fStack_1410 = fVar179 - fStack_1330;
          fStack_140c = fVar182 - fStack_132c;
          fVar123 = fVar185 - fVar168;
          fVar131 = fVar153 - fVar169;
          fVar132 = fVar147 - fVar170;
          fVar133 = fVar154 - fVar171;
          fVar156 = local_11c8 - local_1368;
          fVar158 = fStack_11c4 - fStack_1364;
          fVar160 = fStack_11c0 - fStack_1360;
          fVar174 = fStack_11bc - fStack_135c;
          fVar180 = fVar172 - fVar173;
          fVar186 = fVar152 - fVar176;
          fVar188 = fStack_1350 - fVar179;
          fVar162 = fStack_134c - fVar182;
          fVar134 = (fVar177 * (local_1338 + fVar172) - (fVar150 + local_11c8) * fVar155) * fVar167
                    + ((local_11e8 + fVar185) * fVar155 - (local_1338 + fVar172) * local_13a8) *
                      fVar90 + (local_13a8 * (fVar150 + local_11c8) -
                               (local_11e8 + fVar185) * fVar177) * fVar163;
          fVar120 = (fVar183 * (fStack_1334 + fVar152) - (fVar120 + fStack_11c4) * fVar157) *
                    fVar167 + ((fStack_11e4 + fVar153) * fVar157 -
                              (fStack_1334 + fVar152) * fStack_13a4) * fVar90 +
                              (fStack_13a4 * (fVar120 + fStack_11c4) -
                              (fStack_11e4 + fVar153) * fVar183) * fVar163;
          local_11d8 = (undefined1  [8])CONCAT44(fVar120,fVar134);
          fStack_11d0 = (fVar187 * (fStack_1330 + fStack_1350) - (fVar121 + fStack_11c0) * fVar159)
                        * fVar167 +
                        ((fVar151 + fVar147) * fVar159 - (fStack_1330 + fStack_1350) * fStack_13a0)
                        * fVar90 +
                        (fStack_13a0 * (fVar121 + fStack_11c0) - (fVar151 + fVar147) * fVar187) *
                        fVar163;
          fStack_11cc = (fVar189 * (fStack_132c + fStack_134c) - (fVar122 + fStack_11bc) * fVar161)
                        * fVar167 +
                        ((fVar91 + fVar154) * fVar161 - (fStack_132c + fStack_134c) * fStack_139c) *
                        fVar90 + (fStack_139c * (fVar122 + fStack_11bc) -
                                 (fVar91 + fVar154) * fVar189) * fVar163;
          fVar175 = fVar168 - local_11e8;
          fVar178 = fVar169 - fStack_11e4;
          fVar181 = fVar170 - fVar151;
          fVar184 = fVar171 - fVar91;
          fVar121 = (fVar156 * (fVar173 + fVar172) - (local_1368 + local_11c8) * fVar180) * fVar167
                    + ((fVar185 + fVar168) * fVar180 - (fVar173 + fVar172) * fVar123) * fVar90 +
                      (fVar123 * (local_1368 + local_11c8) - (fVar185 + fVar168) * fVar156) *
                      fVar163;
          fVar122 = (fVar158 * (fVar176 + fVar152) - (fStack_1364 + fStack_11c4) * fVar186) *
                    fVar167 + ((fVar153 + fVar169) * fVar186 - (fVar176 + fVar152) * fVar131) *
                              fVar90 + (fVar131 * (fStack_1364 + fStack_11c4) -
                                       (fVar153 + fVar169) * fVar158) * fVar163;
          fVar179 = (fVar160 * (fVar179 + fStack_1350) - (fStack_1360 + fStack_11c0) * fVar188) *
                    fVar167 + ((fVar147 + fVar170) * fVar188 - (fVar179 + fStack_1350) * fVar132) *
                              fVar90 + (fVar132 * (fStack_1360 + fStack_11c0) -
                                       (fVar147 + fVar170) * fVar160) * fVar163;
          fVar182 = (fVar174 * (fVar182 + fStack_134c) - (fStack_135c + fStack_11bc) * fVar162) *
                    fVar167 + ((fVar154 + fVar171) * fVar162 - (fVar182 + fStack_134c) * fVar133) *
                              fVar90 + (fVar133 * (fStack_135c + fStack_11bc) -
                                       (fVar154 + fVar171) * fVar174) * fVar163;
          auVar58._0_4_ =
               (fVar89 * local_1318 - local_1328 * fVar148) * fVar167 +
               ((local_11e8 + fVar168) * fVar148 - local_1318 * fVar175) * fVar90 +
               (fVar175 * local_1328 - (local_11e8 + fVar168) * fVar89) * fVar163;
          auVar58._4_4_ =
               (fVar64 * fStack_1314 - fStack_1324 * fVar88) * fVar167 +
               ((fStack_11e4 + fVar169) * fVar88 - fStack_1314 * fVar178) * fVar90 +
               (fVar178 * fStack_1324 - (fStack_11e4 + fVar169) * fVar64) * fVar163;
          auVar58._8_4_ =
               (fVar106 * fStack_1310 - fStack_1320 * fStack_1410) * fVar167 +
               ((fVar151 + fVar170) * fStack_1410 - fStack_1310 * fVar181) * fVar90 +
               (fVar181 * fStack_1320 - (fVar151 + fVar170) * fVar106) * fVar163;
          auVar58._12_4_ =
               (fVar119 * fStack_130c - fStack_131c * fStack_140c) * fVar167 +
               ((fVar91 + fVar171) * fStack_140c - fStack_130c * fVar184) * fVar90 +
               (fVar184 * fStack_131c - (fVar91 + fVar171) * fVar119) * fVar163;
          local_11e8 = fVar134 + fVar121 + auVar58._0_4_;
          fStack_11e4 = fVar120 + fVar122 + auVar58._4_4_;
          fStack_11e0 = fStack_11d0 + fVar179 + auVar58._8_4_;
          fStack_11dc = fStack_11cc + fVar182 + auVar58._12_4_;
          auVar78._8_4_ = fStack_11d0;
          auVar78._0_8_ = local_11d8;
          auVar78._12_4_ = fStack_11cc;
          auVar19._4_4_ = fVar122;
          auVar19._0_4_ = fVar121;
          auVar19._8_4_ = fVar179;
          auVar19._12_4_ = fVar182;
          auVar138 = minps(auVar78,auVar19);
          auVar138 = minps(auVar138,auVar58);
          auVar20._4_4_ = fVar122;
          auVar20._0_4_ = fVar121;
          auVar20._8_4_ = fVar179;
          auVar20._12_4_ = fVar182;
          auVar165 = maxps(_local_11d8,auVar20);
          auVar165 = maxps(auVar165,auVar58);
          fVar91 = ABS(local_11e8) * 1.1920929e-07;
          fVar150 = ABS(fStack_11e4) * 1.1920929e-07;
          fVar173 = ABS(fStack_11e0) * 1.1920929e-07;
          fVar176 = ABS(fStack_11dc) * 1.1920929e-07;
          auVar141._4_4_ = -(uint)(auVar165._4_4_ <= fVar150);
          auVar141._0_4_ = -(uint)(auVar165._0_4_ <= fVar91);
          auVar141._8_4_ = -(uint)(auVar165._8_4_ <= fVar173);
          auVar141._12_4_ = -(uint)(auVar165._12_4_ <= fVar176);
          auVar79._4_4_ = -(uint)(-fVar150 <= auVar138._4_4_);
          auVar79._0_4_ = -(uint)(-fVar91 <= auVar138._0_4_);
          auVar79._8_4_ = -(uint)(-fVar173 <= auVar138._8_4_);
          auVar79._12_4_ = -(uint)(-fVar176 <= auVar138._12_4_);
          auVar141 = auVar141 | auVar79;
          iVar26 = movmskps(uVar34,auVar141);
          if (iVar26 != 0) {
            uVar34 = -(uint)(ABS(fVar89 * fVar180) <= ABS(fVar156 * fVar155));
            uVar43 = -(uint)(ABS(fVar64 * fVar186) <= ABS(fVar158 * fVar157));
            uVar46 = -(uint)(ABS(fVar106 * fVar188) <= ABS(fVar160 * fVar159));
            uVar49 = -(uint)(ABS(fVar119 * fVar162) <= ABS(fVar174 * fVar161));
            uVar41 = -(uint)(ABS(fVar123 * fVar148) <= ABS(local_13a8 * fVar180));
            uVar44 = -(uint)(ABS(fVar131 * fVar88) <= ABS(fStack_13a4 * fVar186));
            uVar47 = -(uint)(ABS(fVar132 * fStack_1410) <= ABS(fStack_13a0 * fVar188));
            uVar50 = -(uint)(ABS(fVar133 * fStack_140c) <= ABS(fStack_139c * fVar162));
            uVar42 = -(uint)(ABS(fVar175 * fVar156) <= ABS(fVar123 * fVar177));
            uVar45 = -(uint)(ABS(fVar178 * fVar158) <= ABS(fVar131 * fVar183));
            uVar48 = -(uint)(ABS(fVar181 * fVar160) <= ABS(fVar132 * fVar187));
            uVar51 = -(uint)(ABS(fVar184 * fVar174) <= ABS(fVar133 * fVar189));
            local_1258[0] =
                 (float)(~uVar34 & (uint)(fVar177 * fVar180 - fVar156 * fVar155) |
                        (uint)(fVar156 * fVar148 - fVar89 * fVar180) & uVar34);
            local_1258[1] =
                 (float)(~uVar43 & (uint)(fVar183 * fVar186 - fVar158 * fVar157) |
                        (uint)(fVar158 * fVar88 - fVar64 * fVar186) & uVar43);
            local_1258[2] =
                 (float)(~uVar46 & (uint)(fVar187 * fVar188 - fVar160 * fVar159) |
                        (uint)(fVar160 * fStack_1410 - fVar106 * fVar188) & uVar46);
            local_1258[3] =
                 (float)(~uVar49 & (uint)(fVar189 * fVar162 - fVar174 * fVar161) |
                        (uint)(fVar174 * fStack_140c - fVar119 * fVar162) & uVar49);
            local_1248._0_4_ =
                 ~uVar41 & (uint)(fVar155 * fVar123 - local_13a8 * fVar180) |
                 (uint)(fVar175 * fVar180 - fVar123 * fVar148) & uVar41;
            local_1248._4_4_ =
                 ~uVar44 & (uint)(fVar157 * fVar131 - fStack_13a4 * fVar186) |
                 (uint)(fVar178 * fVar186 - fVar131 * fVar88) & uVar44;
            fStack_1240 = (float)(~uVar47 & (uint)(fVar159 * fVar132 - fStack_13a0 * fVar188) |
                                 (uint)(fVar181 * fVar188 - fVar132 * fStack_1410) & uVar47);
            fStack_123c = (float)(~uVar50 & (uint)(fVar161 * fVar133 - fStack_139c * fVar162) |
                                 (uint)(fVar184 * fVar162 - fVar133 * fStack_140c) & uVar50);
            local_1238[0] =
                 (float)(~uVar42 & (uint)(local_13a8 * fVar156 - fVar123 * fVar177) |
                        (uint)(fVar123 * fVar89 - fVar175 * fVar156) & uVar42);
            local_1238[1] =
                 (float)(~uVar45 & (uint)(fStack_13a4 * fVar158 - fVar131 * fVar183) |
                        (uint)(fVar131 * fVar64 - fVar178 * fVar158) & uVar45);
            local_1238[2] =
                 (float)(~uVar48 & (uint)(fStack_13a0 * fVar160 - fVar132 * fVar187) |
                        (uint)(fVar132 * fVar106 - fVar181 * fVar160) & uVar48);
            local_1238[3] =
                 (float)(~uVar51 & (uint)(fStack_139c * fVar174 - fVar133 * fVar189) |
                        (uint)(fVar133 * fVar119 - fVar184 * fVar174) & uVar51);
            fVar91 = fVar167 * local_1258[0] +
                     fVar90 * (float)local_1248._0_4_ + fVar163 * local_1238[0];
            fVar89 = fVar167 * local_1258[1] +
                     fVar90 * (float)local_1248._4_4_ + fVar163 * local_1238[1];
            fVar148 = fVar167 * local_1258[2] + fVar90 * fStack_1240 + fVar163 * local_1238[2];
            fVar90 = fVar167 * local_1258[3] + fVar90 * fStack_123c + fVar163 * local_1238[3];
            auVar149._0_4_ = fVar91 + fVar91;
            auVar149._4_4_ = fVar89 + fVar89;
            auVar149._8_4_ = fVar148 + fVar148;
            auVar149._12_4_ = fVar90 + fVar90;
            auVar80._0_4_ = local_11c8 * (float)local_1248._0_4_ + fVar172 * local_1238[0];
            auVar80._4_4_ = fStack_11c4 * (float)local_1248._4_4_ + fVar152 * local_1238[1];
            auVar80._8_4_ = fStack_11c0 * fStack_1240 + fStack_1350 * local_1238[2];
            auVar80._12_4_ = fStack_11bc * fStack_123c + fStack_134c * local_1238[3];
            fVar167 = fVar185 * local_1258[0] + auVar80._0_4_;
            fVar172 = fVar153 * local_1258[1] + auVar80._4_4_;
            fVar148 = fVar147 * local_1258[2] + auVar80._8_4_;
            fVar152 = fVar154 * local_1258[3] + auVar80._12_4_;
            auVar138 = rcpps(auVar80,auVar149);
            fVar91 = auVar138._0_4_;
            fVar89 = auVar138._4_4_;
            fVar90 = auVar138._8_4_;
            fVar163 = auVar138._12_4_;
            fVar167 = ((1.0 - auVar149._0_4_ * fVar91) * fVar91 + fVar91) * (fVar167 + fVar167);
            fVar172 = ((1.0 - auVar149._4_4_ * fVar89) * fVar89 + fVar89) * (fVar172 + fVar172);
            fVar90 = ((1.0 - auVar149._8_4_ * fVar90) * fVar90 + fVar90) * (fVar148 + fVar148);
            fVar163 = ((1.0 - auVar149._12_4_ * fVar163) * fVar163 + fVar163) * (fVar152 + fVar152);
            fVar89 = *(float *)(ray + k * 4 + 0x80);
            fVar91 = *(float *)(ray + k * 4 + 0x30);
            auVar114._4_4_ = -(uint)(fVar91 <= fVar172);
            auVar114._0_4_ = -(uint)(fVar91 <= fVar167);
            auVar114._8_4_ = -(uint)(fVar91 <= fVar90);
            auVar114._12_4_ = -(uint)(fVar91 <= fVar163);
            local_1318 = auVar141._0_4_;
            fStack_1314 = auVar141._4_4_;
            fStack_1310 = auVar141._8_4_;
            fStack_130c = auVar141._12_4_;
            auVar81._0_4_ = -(uint)(fVar167 <= fVar89 && fVar91 <= fVar167) & (uint)local_1318;
            auVar81._4_4_ = -(uint)(fVar172 <= fVar89 && fVar91 <= fVar172) & (uint)fStack_1314;
            auVar81._8_4_ = -(uint)(fVar90 <= fVar89 && fVar91 <= fVar90) & (uint)fStack_1310;
            auVar81._12_4_ = -(uint)(fVar163 <= fVar89 && fVar91 <= fVar163) & (uint)fStack_130c;
            iVar26 = movmskps(iVar26,auVar81);
            if (iVar26 != 0) {
              valid.field_0.i[0] = auVar81._0_4_ & -(uint)(auVar149._0_4_ != 0.0);
              valid.field_0.i[1] = auVar81._4_4_ & -(uint)(auVar149._4_4_ != 0.0);
              valid.field_0.i[2] = auVar81._8_4_ & -(uint)(auVar149._8_4_ != 0.0);
              valid.field_0.i[3] = auVar81._12_4_ & -(uint)(auVar149._12_4_ != 0.0);
              iVar26 = movmskps(iVar26,(undefined1  [16])valid.field_0);
              if (iVar26 != 0) {
                tNear.field_0.v[2] = fStack_11d0;
                tNear.field_0._0_8_ = local_11d8;
                tNear.field_0.v[3] = fStack_11cc;
                auVar23._4_4_ = fStack_11e4;
                auVar23._0_4_ = local_11e8;
                auVar23._8_4_ = fStack_11e0;
                auVar23._12_4_ = fStack_11dc;
                local_1268[0] = fVar167;
                local_1268[1] = fVar172;
                local_1268[2] = fVar90;
                local_1268[3] = fVar163;
                local_1228 = local_1058._0_4_;
                uStack_1224 = local_1058._4_4_;
                uStack_1220 = local_1058._8_4_;
                uStack_121c = local_1058._12_4_;
                pSVar37 = context->scene;
                auVar138 = rcpps(auVar114,auVar23);
                fVar91 = auVar138._0_4_;
                fVar148 = auVar138._4_4_;
                fVar152 = auVar138._8_4_;
                fVar64 = auVar138._12_4_;
                fVar150 = (float)DAT_01f7ba10;
                fVar173 = DAT_01f7ba10._4_4_;
                fVar176 = DAT_01f7ba10._12_4_;
                fVar88 = DAT_01f7ba10._8_4_;
                fVar91 = (float)(-(uint)(1e-18 <= ABS(local_11e8)) &
                                (uint)((fVar150 - local_11e8 * fVar91) * fVar91 + fVar91));
                fVar148 = (float)(-(uint)(1e-18 <= ABS(fStack_11e4)) &
                                 (uint)((fVar173 - fStack_11e4 * fVar148) * fVar148 + fVar148));
                fVar152 = (float)(-(uint)(1e-18 <= ABS(fStack_11e0)) &
                                 (uint)((fVar88 - fStack_11e0 * fVar152) * fVar152 + fVar152));
                fVar64 = (float)(-(uint)(1e-18 <= ABS(fStack_11dc)) &
                                (uint)((fVar176 - fStack_11dc * fVar64) * fVar64 + fVar64));
                auVar142._0_4_ = fVar134 * fVar91;
                auVar142._4_4_ = fVar120 * fVar148;
                auVar142._8_4_ = fStack_11d0 * fVar152;
                auVar142._12_4_ = fStack_11cc * fVar64;
                auVar165 = minps(auVar142,_DAT_01f7ba10);
                auVar100._0_4_ = fVar91 * fVar121;
                auVar100._4_4_ = fVar148 * fVar122;
                auVar100._8_4_ = fVar152 * fVar179;
                auVar100._12_4_ = fVar64 * fVar182;
                auVar138 = minps(auVar100,_DAT_01f7ba10);
                auVar115._0_4_ = (uint)(fVar150 - auVar165._0_4_) & local_1058._0_4_;
                auVar115._4_4_ = (uint)(fVar173 - auVar165._4_4_) & local_1058._4_4_;
                auVar115._8_4_ = (uint)(fVar88 - auVar165._8_4_) & local_1058._8_4_;
                auVar115._12_4_ = (uint)(fVar176 - auVar165._12_4_) & local_1058._12_4_;
                auVar143._0_4_ = (uint)auVar165._0_4_ & local_1078._0_4_;
                auVar143._4_4_ = (uint)auVar165._4_4_ & local_1078._4_4_;
                auVar143._8_4_ = (uint)auVar165._8_4_ & local_1078._8_4_;
                auVar143._12_4_ = (uint)auVar165._12_4_ & local_1078._12_4_;
                local_1288 = auVar143 | auVar115;
                auVar130._0_4_ = (uint)(fVar150 - auVar138._0_4_) & local_1058._0_4_;
                auVar130._4_4_ = (uint)(fVar173 - auVar138._4_4_) & local_1058._4_4_;
                auVar130._8_4_ = (uint)(fVar88 - auVar138._8_4_) & local_1058._8_4_;
                auVar130._12_4_ = (uint)(fVar176 - auVar138._12_4_) & local_1058._12_4_;
                auVar101._0_4_ = (uint)auVar138._0_4_ & local_1078._0_4_;
                auVar101._4_4_ = (uint)auVar138._4_4_ & local_1078._4_4_;
                auVar101._8_4_ = (uint)auVar138._8_4_ & local_1078._8_4_;
                auVar101._12_4_ = (uint)auVar138._12_4_ & local_1078._12_4_;
                local_1278 = auVar101 | auVar130;
                auVar59._0_4_ = (uint)fVar167 & valid.field_0.i[0];
                auVar59._4_4_ = (uint)fVar172 & valid.field_0.i[1];
                auVar59._8_4_ = (uint)fVar90 & valid.field_0.i[2];
                auVar59._12_4_ = (uint)fVar163 & valid.field_0.i[3];
                auVar102._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar102._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar102._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar102 = auVar102 | auVar59;
                auVar116._4_4_ = auVar102._0_4_;
                auVar116._0_4_ = auVar102._4_4_;
                auVar116._8_4_ = auVar102._12_4_;
                auVar116._12_4_ = auVar102._8_4_;
                auVar138 = minps(auVar116,auVar102);
                auVar60._0_8_ = auVar138._8_8_;
                auVar60._8_4_ = auVar138._0_4_;
                auVar60._12_4_ = auVar138._4_4_;
                auVar138 = minps(auVar60,auVar138);
                auVar61._0_8_ =
                     CONCAT44(-(uint)(auVar138._4_4_ == auVar102._4_4_) & valid.field_0.i[1],
                              -(uint)(auVar138._0_4_ == auVar102._0_4_) & valid.field_0.i[0]);
                auVar61._8_4_ = -(uint)(auVar138._8_4_ == auVar102._8_4_) & valid.field_0.i[2];
                auVar61._12_4_ = -(uint)(auVar138._12_4_ == auVar102._12_4_) & valid.field_0.i[3];
                iVar26 = movmskps(iVar26,auVar61);
                aVar82 = valid.field_0;
                if (iVar26 != 0) {
                  aVar82.i[2] = auVar61._8_4_;
                  aVar82._0_8_ = auVar61._0_8_;
                  aVar82.i[3] = auVar61._12_4_;
                }
                uVar27 = movmskps(iVar26,(undefined1  [16])aVar82);
                lVar39 = 0;
                if (CONCAT44(uVar28,uVar27) != 0) {
                  for (; (CONCAT44(uVar28,uVar27) >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                  }
                }
LAB_001f5775:
                uVar34 = puVar38[lVar39];
                uVar33 = (ulong)uVar34;
                pGVar17 = (pSVar37->geometries).items[uVar33].ptr;
                if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar39] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar28 = *(undefined4 *)(local_1288 + lVar39 * 4);
                    fVar91 = local_1268[lVar39 + -4];
                    *(float *)(ray + k * 4 + 0x80) = local_1268[lVar39];
                    *(float *)(ray + k * 4 + 0xc0) = local_1258[lVar39];
                    *(float *)(ray + k * 4 + 0xd0) = local_1238[lVar39 + -4];
                    *(float *)(ray + k * 4 + 0xe0) = local_1238[lVar39];
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar28;
                    *(float *)(ray + k * 4 + 0x100) = fVar91;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)(lVar30 + 0x50 + lVar39 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar34;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_001f5c6e;
                  }
                  local_1148 = *(undefined4 *)(local_1288 + lVar39 * 4);
                  local_1138 = local_1268[lVar39 + -4];
                  fVar91 = local_1258[lVar39];
                  fVar148 = local_1238[lVar39 + -4];
                  local_1118._4_4_ = uVar34;
                  local_1118._0_4_ = uVar34;
                  local_1118._8_4_ = uVar34;
                  local_1118._12_4_ = uVar34;
                  uVar28 = *(undefined4 *)(lVar30 + 0x50 + lVar39 * 4);
                  local_1128._4_4_ = uVar28;
                  local_1128._0_4_ = uVar28;
                  local_1128._8_4_ = uVar28;
                  local_1128._12_4_ = uVar28;
                  local_1178._4_4_ = fVar91;
                  local_1178._0_4_ = fVar91;
                  fStack_1170 = fVar91;
                  fStack_116c = fVar91;
                  local_1168._4_4_ = fVar148;
                  local_1168._0_4_ = fVar148;
                  fStack_1160 = fVar148;
                  fStack_115c = fVar148;
                  fVar91 = local_1238[lVar39];
                  local_1158._4_4_ = fVar91;
                  local_1158._0_4_ = fVar91;
                  fStack_1150 = fVar91;
                  fStack_114c = fVar91;
                  uStack_1144 = local_1148;
                  uStack_1140 = local_1148;
                  uStack_113c = local_1148;
                  fStack_1134 = local_1138;
                  fStack_1130 = local_1138;
                  fStack_112c = local_1138;
                  local_1108 = context->user->instID[0];
                  uStack_1104 = local_1108;
                  uStack_1100 = local_1108;
                  uStack_10fc = local_1108;
                  local_10f8 = context->user->instPrimID[0];
                  uStack_10f4 = local_10f8;
                  uStack_10f0 = local_10f8;
                  uStack_10ec = local_10f8;
                  *(float *)(ray + k * 4 + 0x80) = local_1268[lVar39];
                  local_13c8 = *(undefined1 (*) [16])
                                (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  args.valid = (int *)local_13c8;
                  args.geometryUserPtr = pGVar17->userPtr;
                  args.context = context->user;
                  args.hit = (RTCHitN *)local_1178;
                  args.N = 4;
                  p_Var31 = pGVar17->intersectionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (p_Var31 != (RTCFilterFunctionN)0x0) {
                    p_Var31 = (RTCFilterFunctionN)(*p_Var31)(&args);
                  }
                  auVar83._0_4_ = -(uint)(local_13c8._0_4_ == 0);
                  auVar83._4_4_ = -(uint)(local_13c8._4_4_ == 0);
                  auVar83._8_4_ = -(uint)(local_13c8._8_4_ == 0);
                  auVar83._12_4_ = -(uint)(local_13c8._12_4_ == 0);
                  uVar34 = movmskps((int)p_Var31,auVar83);
                  pRVar32 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
                  if ((uVar34 ^ 0xf) == 0) {
                    auVar83 = auVar83 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var31 = context->args->filter;
                    if ((p_Var31 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                      p_Var31 = (RTCFilterFunctionN)(*p_Var31)(&args);
                    }
                    auVar62._0_4_ = -(uint)(local_13c8._0_4_ == 0);
                    auVar62._4_4_ = -(uint)(local_13c8._4_4_ == 0);
                    auVar62._8_4_ = -(uint)(local_13c8._8_4_ == 0);
                    auVar62._12_4_ = -(uint)(local_13c8._12_4_ == 0);
                    auVar83 = auVar62 ^ _DAT_01f7ae20;
                    uVar34 = movmskps((int)p_Var31,auVar62);
                    pRVar32 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
                    if ((uVar34 ^ 0xf) != 0) {
                      auVar103._0_4_ = *(uint *)(args.ray + 0xc0) & auVar62._0_4_;
                      auVar103._4_4_ = *(uint *)(args.ray + 0xc4) & auVar62._4_4_;
                      auVar103._8_4_ = *(uint *)(args.ray + 200) & auVar62._8_4_;
                      auVar103._12_4_ = *(uint *)(args.ray + 0xcc) & auVar62._12_4_;
                      auVar146._0_4_ = ~auVar62._0_4_ & *(uint *)args.hit;
                      auVar146._4_4_ = ~auVar62._4_4_ & *(uint *)(args.hit + 4);
                      auVar146._8_4_ = ~auVar62._8_4_ & *(uint *)(args.hit + 8);
                      auVar146._12_4_ = ~auVar62._12_4_ & *(uint *)(args.hit + 0xc);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar146 | auVar103;
                      uVar34 = *(uint *)(args.hit + 0x14);
                      uVar41 = *(uint *)(args.hit + 0x18);
                      uVar42 = *(uint *)(args.hit + 0x1c);
                      *(uint *)(args.ray + 0xd0) =
                           ~auVar62._0_4_ & *(uint *)(args.hit + 0x10) |
                           *(uint *)(args.ray + 0xd0) & auVar62._0_4_;
                      *(uint *)(args.ray + 0xd4) =
                           ~auVar62._4_4_ & uVar34 | *(uint *)(args.ray + 0xd4) & auVar62._4_4_;
                      *(uint *)(args.ray + 0xd8) =
                           ~auVar62._8_4_ & uVar41 | *(uint *)(args.ray + 0xd8) & auVar62._8_4_;
                      *(uint *)(args.ray + 0xdc) =
                           ~auVar62._12_4_ & uVar42 | *(uint *)(args.ray + 0xdc) & auVar62._12_4_;
                      *(undefined1 (*) [16])(args.ray + 0xe0) =
                           ~auVar62 & *(undefined1 (*) [16])(args.hit + 0x20) |
                           *(undefined1 (*) [16])(args.ray + 0xe0) & auVar62;
                      *(undefined1 (*) [16])(args.ray + 0xf0) =
                           ~auVar62 & *(undefined1 (*) [16])(args.hit + 0x30) |
                           *(undefined1 (*) [16])(args.ray + 0xf0) & auVar62;
                      uVar34 = *(uint *)(args.hit + 0x44);
                      uVar41 = *(uint *)(args.hit + 0x48);
                      uVar42 = *(uint *)(args.hit + 0x4c);
                      *(uint *)(args.ray + 0x100) =
                           ~auVar62._0_4_ & *(uint *)(args.hit + 0x40) |
                           *(uint *)(args.ray + 0x100) & auVar62._0_4_;
                      *(uint *)(args.ray + 0x104) =
                           ~auVar62._4_4_ & uVar34 | *(uint *)(args.ray + 0x104) & auVar62._4_4_;
                      *(uint *)(args.ray + 0x108) =
                           ~auVar62._8_4_ & uVar41 | *(uint *)(args.ray + 0x108) & auVar62._8_4_;
                      *(uint *)(args.ray + 0x10c) =
                           ~auVar62._12_4_ & uVar42 | *(uint *)(args.ray + 0x10c) & auVar62._12_4_;
                      uVar34 = *(uint *)(args.hit + 0x54);
                      uVar41 = *(uint *)(args.hit + 0x58);
                      uVar42 = *(uint *)(args.hit + 0x5c);
                      *(uint *)(args.ray + 0x110) =
                           *(uint *)(args.ray + 0x110) & auVar62._0_4_ |
                           ~auVar62._0_4_ & *(uint *)(args.hit + 0x50);
                      *(uint *)(args.ray + 0x114) =
                           *(uint *)(args.ray + 0x114) & auVar62._4_4_ | ~auVar62._4_4_ & uVar34;
                      *(uint *)(args.ray + 0x118) =
                           *(uint *)(args.ray + 0x118) & auVar62._8_4_ | ~auVar62._8_4_ & uVar41;
                      *(uint *)(args.ray + 0x11c) =
                           *(uint *)(args.ray + 0x11c) & auVar62._12_4_ | ~auVar62._12_4_ & uVar42;
                      uVar34 = *(uint *)(args.hit + 100);
                      uVar41 = *(uint *)(args.hit + 0x68);
                      uVar42 = *(uint *)(args.hit + 0x6c);
                      *(uint *)(args.ray + 0x120) =
                           *(uint *)(args.ray + 0x120) & auVar62._0_4_ |
                           ~auVar62._0_4_ & *(uint *)(args.hit + 0x60);
                      *(uint *)(args.ray + 0x124) =
                           *(uint *)(args.ray + 0x124) & auVar62._4_4_ | ~auVar62._4_4_ & uVar34;
                      *(uint *)(args.ray + 0x128) =
                           *(uint *)(args.ray + 0x128) & auVar62._8_4_ | ~auVar62._8_4_ & uVar41;
                      *(uint *)(args.ray + 300) =
                           *(uint *)(args.ray + 300) & auVar62._12_4_ | ~auVar62._12_4_ & uVar42;
                      auVar104._0_4_ = *(uint *)(args.ray + 0x130) & auVar62._0_4_;
                      auVar104._4_4_ = *(uint *)(args.ray + 0x134) & auVar62._4_4_;
                      auVar104._8_4_ = *(uint *)(args.ray + 0x138) & auVar62._8_4_;
                      auVar104._12_4_ = *(uint *)(args.ray + 0x13c) & auVar62._12_4_;
                      auVar117._0_4_ = ~auVar62._0_4_ & *(uint *)(args.hit + 0x70);
                      auVar117._4_4_ = ~auVar62._4_4_ & *(uint *)(args.hit + 0x74);
                      auVar117._8_4_ = ~auVar62._8_4_ & *(uint *)(args.hit + 0x78);
                      auVar117._12_4_ = ~auVar62._12_4_ & *(uint *)(args.hit + 0x7c);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar117 | auVar104;
                      *(undefined1 (*) [16])(args.ray + 0x140) =
                           ~auVar62 & *(undefined1 (*) [16])(args.hit + 0x80) |
                           *(undefined1 (*) [16])(args.ray + 0x140) & auVar62;
                      pRVar32 = args.ray;
                    }
                  }
                  auVar87._0_4_ = auVar83._0_4_ << 0x1f;
                  auVar87._4_4_ = auVar83._4_4_ << 0x1f;
                  auVar87._8_4_ = auVar83._8_4_ << 0x1f;
                  auVar87._12_4_ = auVar83._12_4_ << 0x1f;
                  iVar26 = movmskps((int)pRVar32,auVar87);
                  uVar33 = CONCAT44((int)((ulong)pRVar32 >> 0x20),iVar26);
                  if (iVar26 == 0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar89;
                  }
                  else {
                    fVar89 = *(float *)(ray + k * 4 + 0x80);
                  }
                  valid.field_0.v[lVar39] = 0.0;
                  valid.field_0.i[0] = -(uint)(fVar167 <= fVar89) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar172 <= fVar89) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar90 <= fVar89) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar163 <= fVar89) & valid.field_0.i[3];
                }
                iVar26 = movmskps((int)uVar33,(undefined1  [16])valid.field_0);
                if (iVar26 == 0) goto LAB_001f5c6e;
                uVar34 = valid.field_0._0_4_;
                uVar41 = valid.field_0._4_4_;
                uVar42 = valid.field_0._8_4_;
                uVar43 = valid.field_0._12_4_;
                auVar84._0_4_ = uVar34 & (uint)fVar167;
                auVar84._4_4_ = uVar41 & (uint)fVar172;
                auVar84._8_4_ = uVar42 & (uint)fVar90;
                auVar84._12_4_ = uVar43 & (uint)fVar163;
                auVar105._0_8_ = CONCAT44(~uVar41,~uVar34) & 0x7f8000007f800000;
                auVar105._8_4_ = ~uVar42 & 0x7f800000;
                auVar105._12_4_ = ~uVar43 & 0x7f800000;
                auVar105 = auVar105 | auVar84;
                auVar118._4_4_ = auVar105._0_4_;
                auVar118._0_4_ = auVar105._4_4_;
                auVar118._8_4_ = auVar105._12_4_;
                auVar118._12_4_ = auVar105._8_4_;
                auVar138 = minps(auVar118,auVar105);
                auVar85._0_8_ = auVar138._8_8_;
                auVar85._8_4_ = auVar138._0_4_;
                auVar85._12_4_ = auVar138._4_4_;
                auVar138 = minps(auVar85,auVar138);
                auVar86._0_8_ =
                     CONCAT44(-(uint)(auVar138._4_4_ == auVar105._4_4_) & uVar41,
                              -(uint)(auVar138._0_4_ == auVar105._0_4_) & uVar34);
                auVar86._8_4_ = -(uint)(auVar138._8_4_ == auVar105._8_4_) & uVar42;
                auVar86._12_4_ = -(uint)(auVar138._12_4_ == auVar105._12_4_) & uVar43;
                iVar26 = movmskps(iVar26,auVar86);
                aVar63 = valid.field_0;
                if (iVar26 != 0) {
                  aVar63.i[2] = auVar86._8_4_;
                  aVar63._0_8_ = auVar86._0_8_;
                  aVar63.i[3] = auVar86._12_4_;
                }
                uVar28 = movmskps(iVar26,(undefined1  [16])aVar63);
                uVar33 = CONCAT44((int)(uVar33 >> 0x20),uVar28);
                lVar39 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                  }
                }
                goto LAB_001f5775;
              }
            }
          }
LAB_001f5c6e:
          local_11a8 = local_11a8 + 1;
        } while (local_11a8 != local_11b0);
      }
      uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar165._4_4_ = uVar28;
      auVar165._0_4_ = uVar28;
      auVar165._8_4_ = uVar28;
      auVar165._12_4_ = uVar28;
      auVar138 = local_1218;
      fVar182 = local_1088;
      fVar106 = fStack_1084;
      fVar119 = fStack_1080;
      fVar91 = fStack_107c;
      fVar120 = local_10c8;
      fVar121 = fStack_10c4;
      fVar122 = fStack_10c0;
      fVar167 = fStack_10bc;
      fVar123 = local_10d8;
      fVar131 = fStack_10d4;
      fVar132 = fStack_10d0;
      fVar172 = fStack_10cc;
      fVar133 = local_10e8;
      fVar134 = fStack_10e4;
      fVar151 = fStack_10e0;
      fVar185 = fStack_10dc;
      fVar148 = local_1188;
      fVar152 = fStack_1184;
      fVar64 = fStack_1180;
      fVar88 = fStack_117c;
      fVar150 = local_1198;
      fVar173 = fStack_1194;
      fVar176 = fStack_1190;
      fVar179 = fStack_118c;
      fVar153 = local_1098;
      fVar147 = fStack_1094;
      fVar154 = fStack_1090;
      fVar89 = fStack_108c;
      fVar155 = local_10a8;
      fVar156 = fStack_10a4;
      fVar157 = fStack_10a0;
      fVar90 = fStack_109c;
      fVar158 = local_10b8;
      fVar159 = fStack_10b4;
      fVar160 = fStack_10b0;
      fVar163 = fStack_10ac;
    }
    if (pSVar29 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }